

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile_test.cpp
# Opt level: O0

bool create_test_ini_file(bool last_empty_section)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  int local_24;
  int i;
  pchar *buf;
  FILE *file;
  bool last_empty_section_local;
  
  __stream = fopen("./p_ini_test_file.ini","w");
  if (__stream == (FILE *)0x0) {
    file._7_1_ = false;
  }
  else {
    lVar2 = p_malloc0(0x801);
    for (local_24 = 0; local_24 < 0x800; local_24 = local_24 + 1) {
      *(char *)(lVar2 + local_24) = (char)(local_24 % 0x14) + 'a';
    }
    fprintf(__stream,"[empty_section]\n");
    fprintf(__stream,"[numeric_section]\n");
    fprintf(__stream,"int_parameter_1 = 4\n");
    fprintf(__stream,"int_parameter_2 = 5 ;This is a comment\n");
    fprintf(__stream,"int_parameter_3 = 6 #This is another type of a comment\n");
    fprintf(__stream,"# Whole line is a comment\n");
    fprintf(__stream,"; Yet another comment line\n");
    fprintf(__stream,"float_parameter_1 = 3.24\n");
    fprintf(__stream,"float_parameter_2 = 0.15\n");
    fprintf(__stream,"[string_section]\n");
    fprintf(__stream,"string_parameter_1 = Test string\n");
    fprintf(__stream,"string_parameter_2 = \"Test string with #\'\"\n");
    fprintf(__stream,"string_parameter_3 = \n");
    fprintf(__stream,"string_parameter_4 = 12345 ;Comment\n");
    fprintf(__stream,"string_parameter_4 = 54321\n");
    fprintf(__stream,"string_parameter_5 = \'Test string\'\n");
    fprintf(__stream,"string_parameter_6 = %s\n",lVar2);
    fprintf(__stream,"string_parameter_7 = \'\'\n");
    fprintf(__stream,"string_parameter_8 = \"\"\n");
    fprintf(__stream,"%s = stress line\n",lVar2);
    fprintf(__stream,"[boolean_section]\n");
    fprintf(__stream,"boolean_parameter_1 = TRUE ;True value\n");
    fprintf(__stream,"boolean_parameter_2 = 0 ;False value\n");
    fprintf(__stream,"boolean_parameter_3 = false ;False value\n");
    fprintf(__stream,"boolean_parameter_4 = 1 ;True value\n");
    fprintf(__stream,"[list_section]\n");
    fprintf(__stream,"list_parameter_1 = {1\t2\t5\t10} ;First list\n");
    fprintf(__stream,"list_parameter_2 = {2.0 3.0 5.0} #Second list\n");
    fprintf(__stream,"list_parameter_3 = {true FALSE 1} #Last list\n");
    if (last_empty_section) {
      fprintf(__stream,"[empty_section_2]\n");
    }
    p_free(lVar2);
    iVar1 = fclose(__stream);
    file._7_1_ = iVar1 == 0;
  }
  return file._7_1_;
}

Assistant:

static bool create_test_ini_file (bool last_empty_section)
{
	FILE *file = fopen ("." P_DIR_SEPARATOR "p_ini_test_file.ini", "w");

	if (file == NULL)
		return false;

	pchar *buf = (pchar *) p_malloc0 (PINIFILE_STRESS_LINE + 1);

	for (int i = 0; i < PINIFILE_STRESS_LINE; ++i)
		buf[i] = (pchar) (97 + i % 20);

	/* Empty section */
	fprintf (file, "[empty_section]\n");

	/* Numeric section */
	fprintf (file, "[numeric_section]\n");
	fprintf (file, "int_parameter_1 = 4\n");
	fprintf (file, "int_parameter_2 = 5 ;This is a comment\n");
	fprintf (file, "int_parameter_3 = 6 #This is another type of a comment\n");
	fprintf (file, "# Whole line is a comment\n");
	fprintf (file, "; Yet another comment line\n");
	fprintf (file, "float_parameter_1 = 3.24\n");
	fprintf (file, "float_parameter_2 = 0.15\n");

	/* String section */
	fprintf (file, "[string_section]\n");
	fprintf (file, "string_parameter_1 = Test string\n");
	fprintf (file, "string_parameter_2 = \"Test string with #'\"\n");
	fprintf (file, "string_parameter_3 = \n");
	fprintf (file, "string_parameter_4 = 12345 ;Comment\n");
	fprintf (file, "string_parameter_4 = 54321\n");
	fprintf (file, "string_parameter_5 = 'Test string'\n");
	fprintf (file, "string_parameter_6 = %s\n", buf);
	fprintf (file, "string_parameter_7 = ''\n");
	fprintf (file, "string_parameter_8 = \"\"\n");
	fprintf (file, "%s = stress line\n", buf);

	/* Boolean section */
	fprintf (file, "[boolean_section]\n");
	fprintf (file, "boolean_parameter_1 = TRUE ;True value\n");
	fprintf (file, "boolean_parameter_2 = 0 ;False value\n");
	fprintf (file, "boolean_parameter_3 = false ;False value\n");
	fprintf (file, "boolean_parameter_4 = 1 ;True value\n");

	/* List section */
	fprintf (file, "[list_section]\n");
	fprintf (file, "list_parameter_1 = {1\t2\t5\t10} ;First list\n");
	fprintf (file, "list_parameter_2 = {2.0 3.0 5.0} #Second list\n");
	fprintf (file, "list_parameter_3 = {true FALSE 1} #Last list\n");

	/* Empty section */
	if (last_empty_section)
		fprintf (file, "[empty_section_2]\n");

	p_free (buf);

	return fclose (file) == 0;
}